

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void __thiscall
Test_TemplateModifiers_CleanseAttribute::Test_TemplateModifiers_CleanseAttribute
          (Test_TemplateModifiers_CleanseAttribute *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(TemplateModifiers, CleanseAttribute) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestCleanseAttribute", NULL);
  dict.SetEscapedValue("easy attribute", "top",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("harder attribute", "foo & bar",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("hardest attribute",
                       "top onclick='alert(document.cookie)'",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("equal in middle", "foo = bar",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("leading equal", "=foo",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("trailing equal", "foo=",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("all equals", "===foo===bar===",
                       GOOGLE_NAMESPACE::cleanse_attribute);
  dict.SetEscapedValue("just equals", "===",
                       GOOGLE_NAMESPACE::cleanse_attribute);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy attribute"), "top");
  EXPECT_STREQ(peer.GetSectionValue("harder attribute"), "foo___bar");
  EXPECT_STREQ(peer.GetSectionValue("hardest attribute"),
               "top_onclick=_alert_document.cookie__");

  EXPECT_STREQ(peer.GetSectionValue("equal in middle"), "foo_=_bar");
  EXPECT_STREQ(peer.GetSectionValue("leading equal"), "_foo");
  EXPECT_STREQ(peer.GetSectionValue("trailing equal"), "foo_");
  EXPECT_STREQ(peer.GetSectionValue("just equals"), "_=_");
  EXPECT_STREQ(peer.GetSectionValue("all equals"), "_==foo===bar==_");
}